

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O3

void ego_menu(char *unused,wchar_t also_unused)

{
  char *s;
  _Bool _Var1;
  void *__base;
  angband_constants *paVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  int count;
  ego_item *ego;
  ignore_type_t itype;
  region area;
  menu_iter menu_f;
  menu menu;
  region local_118;
  menu_iter local_108;
  menu local_e0;
  
  local_108.resize = (_func_void_menu_ptr *)0x0;
  local_108.display_row = ego_display;
  local_108.row_handler = ego_action;
  local_108.get_tag = (_func_char_menu_ptr_int *)0x0;
  local_108.valid_row = (_func_int_menu_ptr_int *)0x0;
  local_118.col = 1;
  local_118.row = 5;
  local_118.width = -1;
  local_118.page_rows = -1;
  __base = mem_zalloc((ulong)z_info->e_max * 0x1b0);
  if (z_info->e_max == 0) {
    qsort(__base,0,0x10,ego_comp_func);
  }
  else {
    uVar4 = 0;
    count = 0;
    paVar2 = z_info;
    do {
      if ((e_info[uVar4].name != (char *)0x0) && (ego = e_info + uVar4, ego->everseen == true)) {
        itype = ITYPE_SHARP;
        do {
          _Var1 = ego_has_ignore_type(ego,itype);
          if (_Var1) {
            lVar5 = (long)count * 0x10;
            *(short *)((long)__base + lVar5) = (short)uVar4;
            *(short *)((long)__base + lVar5 + 2) = (short)itype;
            s = ego->name;
            _Var1 = prefix(s,"of the ");
            lVar3 = 7;
            if (!_Var1) {
              _Var1 = prefix(s,"of ");
              lVar3 = (ulong)_Var1 * 3;
            }
            *(char **)((long)__base + lVar5 + 8) = s + lVar3;
            count = count + 1;
          }
          itype = itype + ITYPE_SHARP;
          paVar2 = z_info;
        } while (itype != ITYPE_MAX);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < paVar2->e_max);
    qsort(__base,(long)count,0x10,ego_comp_func);
    if (count != 0) {
      screen_save();
      clear_from(L'\0');
      prt("Ego item ignore menu",L'\0',L'\0');
      text_out_hook = text_out_to_screen;
      text_out_indent = L'\x01';
      text_out_wrap = L'O';
      Term_gotoxy(L'\x01',L'\x01');
      text_out_e(
                "{light green}Movement keys{/} scroll the list\n{light red}ESC{/} returns to the previous menu\n{light blue}Enter{/} toggles the current setting."
                );
      text_out_indent = L'\0';
      memset(&local_e0,0,0xb0);
      menu_init(&local_e0,MN_SKIN_SCROLL,&local_108);
      menu_setpriv(&local_e0,count,__base);
      menu_layout(&local_e0,&local_118);
      menu_select(&local_e0,0,false);
      mem_free(__base);
      screen_load();
      return;
    }
  }
  mem_free(__base);
  return;
}

Assistant:

static void ego_menu(const char *unused, int also_unused)
{
	int max_num = 0;
	struct ego_item *ego;
	struct ego_desc *choice;

	struct menu menu;
	menu_iter menu_f = { 0, 0, ego_display, ego_action, 0 };
	region area = { 1, 5, -1, -1 };
	int cursor = 0;

	int i;

	/* Create the array */
	choice = mem_zalloc(z_info->e_max * ITYPE_MAX * sizeof(struct ego_desc));

	/* Get the valid ego-items */
	for (i = 0; i < z_info->e_max; i++) {
		int itype;
		ego = &e_info[i];

		/* Only valid known ego-items allowed */
		if (!ego->name || !ego->everseen)
			continue;

		/* Find appropriate ignore types */
		for (itype = ITYPE_NONE + 1; itype < ITYPE_MAX; itype++)
			if (ego_has_ignore_type(ego, itype)) {

				/* Fill in the details */
				choice[max_num].e_idx = i;
				choice[max_num].itype = itype;
				choice[max_num].short_name = strip_ego_name(ego->name);

				++max_num;
			}
	}

	/* Quickly sort the array by ego-item name */
	qsort(choice, max_num, sizeof(choice[0]), ego_comp_func);

	/* Return here if there are no objects */
	if (!max_num) {
		mem_free(choice);
		return;
	}


	/* Save the screen and clear it */
	screen_save();
	clear_from(0);

	/* Help text */
	prt("Ego item ignore menu", 0, 0);

	/* Output to the screen */
	text_out_hook = text_out_to_screen;

	/* Indent output */
	text_out_indent = 1;
	text_out_wrap = 79;
	Term_gotoxy(1, 1);

	/* Display some helpful information */
	text_out_e(EGO_MENU_HELPTEXT);

	text_out_indent = 0;

	/* Set up the menu */
	memset(&menu, 0, sizeof(menu));
	menu_init(&menu, MN_SKIN_SCROLL, &menu_f);
	menu_setpriv(&menu, max_num, choice);
	menu_layout(&menu, &area);

	/* Select an entry */
	(void) menu_select(&menu, cursor, false);

	/* Free memory */
	mem_free(choice);

	/* Load screen */
	screen_load();

	return;
}